

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

long ov_bitrate_instant(OggVorbis_File *vf)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  
  if (vf->seekable == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (long)vf->current_link;
  }
  lVar3 = -0x83;
  if (1 < vf->ready_state) {
    dVar1 = vf->samptrack;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar2 = vf->bittrack;
      lVar4 = vf->vi[lVar4].rate;
      vf->bittrack = 0.0;
      vf->samptrack = 0.0;
      return (long)((double)lVar4 * (dVar2 / dVar1) + 0.5);
    }
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

long ov_bitrate_instant(OggVorbis_File *vf){
  int link=(vf->seekable?vf->current_link:0);
  long ret;
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(vf->samptrack==0)return(OV_FALSE);
  ret=vf->bittrack/vf->samptrack*vf->vi[link].rate+.5;
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(ret);
}